

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall cbtQuantizedBvh::cbtQuantizedBvh(cbtQuantizedBvh *this)

{
  this->_vptr_cbtQuantizedBvh = (_func_int **)&PTR__cbtQuantizedBvh_00b6f980;
  this->m_bulletVersion = 0x120;
  this->m_useQuantization = false;
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (cbtOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  (this->m_contiguousNodes).m_ownsMemory = true;
  (this->m_contiguousNodes).m_data = (cbtOptimizedBvhNode *)0x0;
  (this->m_contiguousNodes).m_size = 0;
  (this->m_contiguousNodes).m_capacity = 0;
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (cbtQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  (this->m_quantizedContiguousNodes).m_ownsMemory = true;
  (this->m_quantizedContiguousNodes).m_data = (cbtQuantizedBvhNode *)0x0;
  (this->m_quantizedContiguousNodes).m_size = 0;
  (this->m_quantizedContiguousNodes).m_capacity = 0;
  this->m_traversalMode = TRAVERSAL_STACKLESS;
  (this->m_SubtreeHeaders).m_ownsMemory = true;
  (this->m_SubtreeHeaders).m_data = (cbtBvhSubtreeInfo *)0x0;
  (this->m_SubtreeHeaders).m_size = 0;
  (this->m_SubtreeHeaders).m_capacity = 0;
  this->m_subtreeHeaderCount = 0;
  (this->m_bvhAabbMin).m_floats[0] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[1] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[2] = -3.4028235e+38;
  (this->m_bvhAabbMin).m_floats[3] = 0.0;
  (this->m_bvhAabbMax).m_floats[0] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[1] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[2] = 3.4028235e+38;
  (this->m_bvhAabbMax).m_floats[3] = 0.0;
  return;
}

Assistant:

cbtQuantizedBvh::cbtQuantizedBvh() : m_bulletVersion(BT_BULLET_VERSION),
								   m_useQuantization(false),
								   //m_traversalMode(TRAVERSAL_STACKLESS_CACHE_FRIENDLY)
								   m_traversalMode(TRAVERSAL_STACKLESS)
								   //m_traversalMode(TRAVERSAL_RECURSIVE)
								   ,
								   m_subtreeHeaderCount(0)  //PCK: add this line
{
	m_bvhAabbMin.setValue(-SIMD_INFINITY, -SIMD_INFINITY, -SIMD_INFINITY);
	m_bvhAabbMax.setValue(SIMD_INFINITY, SIMD_INFINITY, SIMD_INFINITY);
}